

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O0

Vec_Ptr_t * Amap_DeriveTokens(char *pBuffer)

{
  int iVar1;
  Vec_Ptr_t *p;
  bool bVar2;
  char *local_20;
  char *pToken;
  Vec_Ptr_t *vTokens;
  char *pBuffer_local;
  
  p = Vec_PtrAlloc(1000);
  local_20 = strtok(pBuffer," =\t\r\n");
  while (local_20 != (char *)0x0) {
    Vec_PtrPush(p,local_20);
    local_20 = strtok((char *)0x0," =\t\r\n");
    if ((local_20 != (char *)0x0) && (iVar1 = strcmp(local_20,"LATCH"), iVar1 == 0)) {
      while( true ) {
        bVar2 = false;
        if (local_20 != (char *)0x0) {
          iVar1 = strcmp(local_20,"GATE");
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_20 = strtok((char *)0x0," =\t\r\n");
      }
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t * Amap_DeriveTokens( char * pBuffer )
{
    Vec_Ptr_t * vTokens;
    char * pToken;
    vTokens = Vec_PtrAlloc( 1000 );
    pToken = strtok( pBuffer, " =\t\r\n" );
    while ( pToken )
    {
        Vec_PtrPush( vTokens, pToken );
        pToken = strtok( NULL, " =\t\r\n" );
        // skip latches
        if ( pToken && strcmp( pToken, "LATCH" ) == 0 )
            while ( pToken && strcmp( pToken, "GATE" ) != 0 )
                pToken = strtok( NULL, " =\t\r\n" );
    }
    return vTokens;
}